

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void wavefront_starvation(size_t W)

{
  char *pcVar1;
  pointer pTVar2;
  code *pcVar3;
  double dVar4;
  FlowBuilder this;
  char extraout_AL;
  TestCaseData *pTVar5;
  ulong *puVar6;
  long *plVar7;
  size_t next_i;
  ulong uVar8;
  ulong uVar9;
  Executor *this_00;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  size_t W_local;
  atomic<unsigned_long> count;
  long local_3d0;
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  G;
  undefined1 local_398 [32];
  atomic<unsigned_long> blocked;
  atomic<unsigned_long> stop;
  shared_ptr<tf::WorkerInterface> local_368;
  ResultBuilder DOCTEST_RB;
  string local_2d8;
  mutex mutex;
  string local_288;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  Taskflow taskflow;
  Executor executor;
  
  W_local = W;
  tf::Taskflow::Taskflow(&taskflow);
  local_368.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_368.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  G.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  G.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  G.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::resize(&G,W_local);
  local_3d0 = 1;
  for (uVar12 = 0; uVar12 < W_local; uVar12 = uVar12 + 1) {
    std::vector<tf::Task,_std::allocator<tf::Task>_>::resize
              (G.
               super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar12,W_local);
    lVar11 = 0;
    for (uVar9 = 0; this._graph = taskflow.super_FlowBuilder._graph, uVar9 < W_local;
        uVar9 = uVar9 + 1) {
      if (uVar12 + uVar9 == 0) {
        pTVar5 = (TestCaseData *)operator_new(0xd8);
        (pTVar5->m_file).field_0.data.ptr = (char *)0x0;
        *(uint **)((long)&(pTVar5->m_file).field_0 + 8) = &pTVar5->m_line;
        *(undefined8 *)((long)&(pTVar5->m_file).field_0 + 0x10) = 0;
        *(undefined1 *)&pTVar5->m_line = 0;
        pcVar1 = (char *)((long)&pTVar5[1].m_file.field_0 + 0x10);
        pTVar5->m_test_suite = (char *)0x0;
        pTVar5->m_description = (char *)0x0;
        pTVar5->m_skip = false;
        pTVar5->m_no_breaks = false;
        pTVar5->m_no_output = false;
        pTVar5->m_may_fail = false;
        pTVar5->m_should_fail = false;
        *(undefined3 *)&pTVar5->field_0x3d = 0;
        *(undefined8 *)&pTVar5->m_expected_failures = 0;
        pTVar5->m_timeout = (double)pcVar1;
        pTVar5[1].m_file.field_0.data.ptr = pcVar1;
        *(char ***)((long)&pTVar5[1].m_file.field_0 + 8) = &pTVar5[1].m_description;
        pTVar5[1].m_description = (char *)0x0;
        pTVar5[1].m_skip = false;
        pTVar5[1].m_no_breaks = false;
        pTVar5[1].m_no_output = false;
        pTVar5[1].m_may_fail = false;
        pTVar5[1].m_should_fail = false;
        *(undefined3 *)&pTVar5[1].field_0x3d = 0;
        *(undefined8 *)&pTVar5[1].m_expected_failures = 0;
        pTVar5[1].m_timeout = 0.0;
        pTVar5[2].m_file.field_0.data.ptr = (char *)0x0;
        plVar7 = (long *)operator_new(0x20);
        *plVar7 = (long)&count;
        plVar7[1] = (long)&stop;
        plVar7[2] = (long)&blocked;
        plVar7[3] = (long)&set;
        *(long **)&pTVar5[1].m_skip = plVar7;
        pTVar5[2].m_file.field_0.data.ptr =
             (char *)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:740:36)>
                     ::_M_invoke;
        pTVar5[1].m_timeout =
             (double)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:740:36)>
                     ::_M_manager;
        *(undefined1 *)&pTVar5[2].m_name = 1;
        pTVar5[2].m_test_suite = (char *)0x0;
        pTVar5[2].m_description = (char *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case = pTVar5;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)this._graph,
                   (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      }
      else if (local_3d0 + uVar9 == W_local) {
        pTVar5 = (TestCaseData *)operator_new(0xd8);
        (pTVar5->m_file).field_0.data.ptr = (char *)0x0;
        *(uint **)((long)&(pTVar5->m_file).field_0 + 8) = &pTVar5->m_line;
        *(undefined8 *)((long)&(pTVar5->m_file).field_0 + 0x10) = 0;
        *(undefined1 *)&pTVar5->m_line = 0;
        pcVar1 = (char *)((long)&pTVar5[1].m_file.field_0 + 0x10);
        pTVar5->m_test_suite = (char *)0x0;
        pTVar5->m_description = (char *)0x0;
        pTVar5->m_skip = false;
        pTVar5->m_no_breaks = false;
        pTVar5->m_no_output = false;
        pTVar5->m_may_fail = false;
        pTVar5->m_should_fail = false;
        *(undefined3 *)&pTVar5->field_0x3d = 0;
        *(undefined8 *)&pTVar5->m_expected_failures = 0;
        pTVar5->m_timeout = (double)pcVar1;
        pTVar5[1].m_file.field_0.data.ptr = pcVar1;
        *(char ***)((long)&pTVar5[1].m_file.field_0 + 8) = &pTVar5[1].m_description;
        pTVar5[1].m_description = (char *)0x0;
        pTVar5[1].m_skip = false;
        pTVar5[1].m_no_breaks = false;
        pTVar5[1].m_no_output = false;
        pTVar5[1].m_may_fail = false;
        pTVar5[1].m_should_fail = false;
        *(undefined3 *)&pTVar5[1].field_0x3d = 0;
        *(undefined8 *)&pTVar5[1].m_expected_failures = 0;
        pTVar5[1].m_timeout = 0.0;
        pTVar5[2].m_file.field_0.data.ptr = (char *)0x0;
        puVar6 = (ulong *)operator_new(0x48);
        *puVar6 = uVar12;
        puVar6[1] = uVar9;
        puVar6[2] = (ulong)&count;
        puVar6[3] = (ulong)&W_local;
        puVar6[4] = (ulong)&blocked;
        puVar6[5] = (ulong)&stop;
        puVar6[6] = (ulong)&set;
        puVar6[7] = (ulong)&mutex;
        puVar6[8] = (ulong)&executor;
        *(ulong **)&pTVar5[1].m_skip = puVar6;
        pTVar5[2].m_file.field_0.data.ptr =
             (char *)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:750:36)>
                     ::_M_invoke;
        pTVar5[1].m_timeout =
             (double)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:750:36)>
                     ::_M_manager;
        *(undefined1 *)&pTVar5[2].m_name = 1;
        pTVar5[2].m_test_suite = (char *)0x0;
        pTVar5[2].m_description = (char *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case = pTVar5;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)this._graph,
                   (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      }
      else {
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
        ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
        *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
             &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
        *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) =
             0;
        *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
        pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
        (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
        *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
        *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
        *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
             &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
        *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
        *(atomic<unsigned_long> **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &count;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
             (char *)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:780:36)>
                     ::_M_invoke;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
             (double)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:780:36)>
                     ::_M_manager;
        *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)this._graph,
                   (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      }
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      pTVar2 = G.
               super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(Node **)((long)&pTVar2->_node + lVar11) =
           ((this._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      std::__cxx11::to_string(&local_288,uVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     &local_288,", ");
      std::__cxx11::to_string(&local_2d8,uVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DOCTEST_RB,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     &local_2d8);
      tf::Task::name((Task *)((long)&pTVar2->_node + lVar11),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DOCTEST_RB);
      std::__cxx11::string::~string((string *)&DOCTEST_RB);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)&local_288);
      lVar11 = lVar11 + 8;
    }
    local_3d0 = local_3d0 + 1;
  }
  uVar12 = 0;
  uVar9 = W_local;
  while (uVar8 = uVar12, uVar8 < uVar9) {
    uVar12 = uVar8 + 1;
    lVar11 = 0;
    for (uVar10 = 1; uVar10 - 1 < uVar9; uVar10 = uVar10 + 1) {
      if (uVar12 < uVar9) {
        tf::Task::precede<tf::Task&>
                  ((Task *)((long)&(G.
                                    super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                    super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                                    super__Vector_impl_data._M_start)->_node + lVar11),
                   (Task *)((long)&(G.
                                    super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                    super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                                    super__Vector_impl_data._M_start)->_node + lVar11));
        uVar9 = W_local;
      }
      if (uVar10 < uVar9) {
        pTVar2 = G.
                 super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start;
        tf::Task::precede<tf::Task&>
                  ((Task *)((long)&pTVar2->_node + lVar11),(Task *)((long)&pTVar2[1]._node + lVar11)
                  );
        uVar9 = W_local;
      }
      lVar11 = lVar11 + 8;
    }
  }
  this_00 = &executor;
  tf::Executor::run_n((Future<void> *)&DOCTEST_RB,this_00,&taskflow,0x400);
  std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB,this_00);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x327;
  DOCTEST_RB.super_AssertData.m_expr = "count == W*W*1024";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_288._M_dataplus._M_p = (pointer)&count;
  local_2d8._M_dataplus._M_p = (pointer)(W_local * W_local * 0x400);
  local_288._M_string_length._0_4_ = DOCTEST_RB.super_AssertData.m_at;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            ((Result *)local_398,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_288,
             (unsigned_long *)&local_2d8);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)local_398);
  doctest::String::~String((String *)(local_398 + 8));
  dVar4 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar4,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::~vector(&G);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void wavefront_starvation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count{0}, blocked;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  std::vector<std::vector<tf::Task>> G;
  G.resize(W);

  // create tasks
  for(size_t i=0; i<W; i++) {
    G[i].resize(W);
    for(size_t j=0; j<W; j++) {
      // source
      if(i + j == 0) {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
          stop.store(false, std::memory_order_relaxed);
          blocked.store(0, std::memory_order_relaxed);
          set.clear();
        });
      }
      // diagonal tasks
      else if(i + j + 1 == W) {
        
        G[i][j] = taskflow.emplace([&, i, j](){

          count.fetch_add(1, std::memory_order_relaxed);
          
          // top-right will unblock all W-1 workers
          if(i == 0 && j + 1 == W) {
            while(blocked.load(std::memory_order_acquire) + 1 != W) {
              std::this_thread::yield();
            }
            stop.store(true, std::memory_order_relaxed);
            REQUIRE(set.size() + 1 == W);
          }
          else {
            // record the worker
            {
              std::scoped_lock lock(mutex);
              set.insert(executor.this_worker_id());
            }

            blocked.fetch_add(1, std::memory_order_release);

            // block the worker
            while(stop.load(std::memory_order_relaxed) == false) {
              std::this_thread::yield();
            }
          }
        });
      }
      // other tasks
      else {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
        });
      }

      // name the task
      G[i][j].name(std::to_string(i) + ", " + std::to_string(j));
    }
  }

  // create dependency
  for(size_t i=0; i<W; i++) {
    for(size_t j=0; j<W; j++) {
      size_t next_i = i + 1;
      size_t next_j = j + 1;
      if(next_i < W) {
        G[i][j].precede(G[next_i][j]);
      }
      if(next_j < W) {
        G[i][j].precede(G[i][next_j]);
      }
    }
  }

  //taskflow.dump(std::cout);
  executor.run_n(taskflow, 1024).wait();

  REQUIRE(count == W*W*1024);
}